

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall
Parser::createForLoopNode
          (Parser *this,Token *t,Node *optional_initialization,Node *optional_expression,
          Node *optional_increment,Node *loop_body)

{
  Node *token;
  Node *n;
  CompilationContext *in_stack_ffffffffffffffb8;
  Node *in_stack_ffffffffffffffc0;
  
  token = (Node *)operator_new(0x30);
  Node::Node(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(Token *)token);
  *(undefined4 *)&token->nodeType = 0x25;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffffc0,
             (value_type *)in_stack_ffffffffffffffb8);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffffc0,
             (value_type *)in_stack_ffffffffffffffb8);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffffc0,
             (value_type *)in_stack_ffffffffffffffb8);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffffc0,
             (value_type *)in_stack_ffffffffffffffb8);
  return token;
}

Assistant:

Node * createForLoopNode(Token & t, Node * optional_initialization, Node * optional_expression,
    Node * optional_increment, Node * loop_body)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_FOR_LOOP;
    n->children.push_back(optional_initialization);
    n->children.push_back(optional_expression);
    n->children.push_back(optional_increment);
    n->children.push_back(loop_body);
    return n;
  }